

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanTag(Scanner *this)

{
  uint AtColumn;
  iterator pcVar1;
  bool bVar2;
  byte *pbVar3;
  ulong uVar4;
  byte *Position;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar1 = this->Current;
  AtColumn = this->Column;
  skip(this,1);
  Position = (byte *)this->Current;
  if (Position == (byte *)this->End) goto LAB_00dc9782;
  uVar4 = (ulong)*Position;
  pbVar3 = Position;
  if (uVar4 < 0x3d) {
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_00dc9782;
    if (uVar4 == 0x3c) {
      skip(this,1);
      scan_ns_uri_char(this);
      bVar2 = consume(this,0x3e);
      if (!bVar2) {
        return false;
      }
      Position = (byte *)this->Current;
      goto LAB_00dc9782;
    }
  }
  do {
    Position = pbVar3;
    pbVar3 = (byte *)skip_ns_char(this,(iterator)Position);
  } while (pbVar3 != Position);
  this->Current = (iterator)pbVar3;
LAB_00dc9782:
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_68._0_4_ = TK_Tag;
  local_68._16_8_ = (long)Position - (long)pcVar1;
  local_68._8_8_ = pcVar1;
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_68);
  saveSimpleKeyCandidate
            (this,(iterator)
                  (this->TokenQueue).List.Sentinel.
                  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                  .super_node_base_type.Prev,AtColumn,false);
  this->IsSimpleKeyAllowed = false;
  std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

bool Scanner::scanTag() {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  skip(1); // Eat !.
  if (Current == End || isBlankOrBreak(Current)); // An empty tag.
  else if (*Current == '<') {
    skip(1);
    scan_ns_uri_char();
    if (!consume('>'))
      return false;
  } else {
    // FIXME: Actually parse the c-ns-shorthand-tag rule.
    Current = skip_while(&Scanner::skip_ns_char, Current);
  }

  Token T;
  T.Kind = Token::TK_Tag;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  // Tags can be simple keys.
  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}